

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode Curl_mime_set_subparts(curl_mimepart *part,curl_mime *subparts,int take_ownership)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  curl_mime *local_30;
  curl_mime *root;
  int take_ownership_local;
  curl_mime *subparts_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if ((part->kind == MIMEKIND_MULTIPART) && ((curl_mime *)part->arg == subparts)) {
    part_local._4_4_ = CURLE_OK;
  }
  else {
    cleanup_part_content(part);
    if (subparts != (curl_mime *)0x0) {
      if (subparts->parent != (curl_mimepart *)0x0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      local_30 = part->parent;
      if (local_30 != (curl_mime *)0x0) {
        while( true ) {
          bVar3 = false;
          if (local_30->parent != (curl_mimepart *)0x0) {
            bVar3 = local_30->parent->parent != (curl_mime *)0x0;
          }
          if (!bVar3) break;
          local_30 = local_30->parent->parent;
        }
        if (subparts == local_30) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
      }
      iVar1 = mime_subparts_seek(subparts,0,0);
      if (iVar1 != 0) {
        return CURLE_SEND_FAIL_REWIND;
      }
      subparts->parent = part;
      part->seekfunc = mime_subparts_seek;
      pcVar2 = mime_subparts_unbind;
      if (take_ownership != 0) {
        pcVar2 = mime_subparts_free;
      }
      part->freefunc = pcVar2;
      part->arg = subparts;
      part->datasize = -1;
      part->kind = MIMEKIND_MULTIPART;
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode Curl_mime_set_subparts(curl_mimepart *part,
                                curl_mime *subparts, int take_ownership)
{
  curl_mime *root;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Accept setting twice the same subparts. */
  if(part->kind == MIMEKIND_MULTIPART && part->arg == subparts)
    return CURLE_OK;

  cleanup_part_content(part);

  if(subparts) {
    /* Should not have been attached already. */
    if(subparts->parent)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    /* Should not be the part's root. */
    root = part->parent;
    if(root) {
      while(root->parent && root->parent->parent)
        root = root->parent->parent;
      if(subparts == root) {
        /* cannot add as a subpart of itself. */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }

    /* If subparts have already been used as a top-level MIMEPOST,
       they might not be positioned at start. Rewind them now, as
       a future check while rewinding the parent may cause this
       content to be skipped. */
    if(mime_subparts_seek(subparts, (curl_off_t) 0, SEEK_SET) !=
       CURL_SEEKFUNC_OK)
      return CURLE_SEND_FAIL_REWIND;

    subparts->parent = part;
    /* Subparts are processed internally: no read callback. */
    part->seekfunc = mime_subparts_seek;
    part->freefunc = take_ownership ? mime_subparts_free :
      mime_subparts_unbind;
    part->arg = subparts;
    part->datasize = -1;
    part->kind = MIMEKIND_MULTIPART;
  }

  return CURLE_OK;
}